

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_msad_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id type_id;
  Id IVar2;
  Id IVar3;
  Id arg;
  Builder *this;
  Operation *pOVar4;
  Value *pVVar5;
  Operation *pOVar6;
  Operation *pOVar7;
  Operation *this_00;
  uint32_t i;
  long lVar8;
  uint32_t i_3;
  uint32_t lit;
  uint32_t i_2;
  uint u;
  uint32_t i_1;
  Vector<spv::Id> src_byte_ids;
  Vector<spv::Id> ref_byte_ids;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  IVar1 = spv::Builder::makeUintType(this,0x20);
  type_id = spv::Builder::makeVectorType(this,IVar1,4);
  IVar2 = spv::Builder::makeBoolType(this);
  IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
  src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ref_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ref_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ref_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&ref_byte_ids,
             &src_byte_ids);
  local_48 = 0;
  uStack_40 = 0;
  src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&src_byte_ids,
             &local_48);
  u = 0;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    pOVar4 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
    Operation::add_id(pOVar4,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,u,false);
    Operation::add_id(pOVar4,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,8,false);
    Operation::add_id(pOVar4,IVar3);
    Converter::Impl::add(impl,pOVar4,false);
    pOVar6 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
    Operation::add_id(pOVar6,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,u,false);
    Operation::add_id(pOVar6,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,8,false);
    Operation::add_id(pOVar6,IVar3);
    Converter::Impl::add(impl,pOVar6,false);
    ref_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar8] = pOVar4->id;
    src_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar8] = pOVar6->id;
    u = u + 8;
  }
  pOVar4 = Converter::Impl::allocate(impl,OpCompositeConstruct,type_id);
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    Operation::add_id(pOVar4,ref_byte_ids.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar8]);
  }
  Converter::Impl::add(impl,pOVar4,false);
  pOVar6 = Converter::Impl::allocate(impl,OpCompositeConstruct,type_id);
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    Operation::add_id(pOVar6,src_byte_ids.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar8]);
  }
  IVar3 = 0;
  Converter::Impl::add(impl,pOVar6,false);
  arg = spv::Builder::makeNullConstant(this,type_id);
  pOVar7 = Converter::Impl::allocate(impl,OpIEqual,IVar2);
  Operation::add_id(pOVar7,pOVar4->id);
  Operation::add_id(pOVar7,arg);
  Converter::Impl::add(impl,pOVar7,false);
  this_00 = Converter::Impl::allocate(impl,OpISub,type_id);
  Operation::add_id(this_00,pOVar4->id);
  Operation::add_id(this_00,pOVar6->id);
  Converter::Impl::add(impl,this_00,false);
  pOVar4 = Converter::Impl::allocate(impl,OpExtInst,type_id);
  Operation::add_id(pOVar4,impl->glsl_std450_ext);
  Operation::add_literal(pOVar4,5);
  Operation::add_id(pOVar4,this_00->id);
  Converter::Impl::add(impl,pOVar4,false);
  pOVar6 = Converter::Impl::allocate(impl,OpSelect,type_id);
  Operation::add_id(pOVar6,pOVar7->id);
  Operation::add_id(pOVar6,arg);
  Operation::add_id(pOVar6,pOVar4->id);
  Converter::Impl::add(impl,pOVar6,false);
  for (lit = 0; lit != 4; lit = lit + 1) {
    pOVar7 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar1);
    Operation::add_id(pOVar7,pOVar6->id);
    Operation::add_literal(pOVar7,lit);
    Converter::Impl::add(impl,pOVar7,false);
    pOVar4 = pOVar7;
    if (IVar3 != 0) {
      pOVar4 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(pOVar4,IVar3);
      Operation::add_id(pOVar4,pOVar7->id);
      Converter::Impl::add(impl,pOVar4,false);
    }
    IVar3 = pOVar4->id;
  }
  pOVar4 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  Operation::add_id(pOVar4,IVar1);
  Operation::add_id(pOVar4,IVar3);
  Converter::Impl::add(impl,pOVar4,false);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&src_byte_ids.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&ref_byte_ids.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  return true;
}

Assistant:

bool emit_msad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	// Don't modify this implementation since compilers pattern match this.

	spv::Id uint32_scalar_type = builder.makeUintType(32);
	spv::Id uint32_vector_type = builder.makeVectorType(uint32_scalar_type, 4);
	spv::Id bool_type = builder.makeVectorType(builder.makeBoolType(), 4);

	Vector<spv::Id> ref_byte_ids = { 0, 0, 0, 0 };
	Vector<spv::Id> src_byte_ids = { 0, 0, 0, 0 };

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *ref_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		ref_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		ref_bfe_op->add_id(builder.makeUintConstant(8 * i));
		ref_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(ref_bfe_op);

		auto *src_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		src_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		src_bfe_op->add_id(builder.makeUintConstant(8 * i));
		src_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(src_bfe_op);

		ref_byte_ids[i] = ref_bfe_op->id;
		src_byte_ids[i] = src_bfe_op->id;
	}

	auto *ref_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		ref_composite_op->add_id(ref_byte_ids[i]);
	impl.add(ref_composite_op);

	auto *src_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		src_composite_op->add_id(src_byte_ids[i]);
	impl.add(src_composite_op);

	spv::Id zero_vector = builder.makeNullConstant(uint32_vector_type);

	auto *compare_ref_zero_op = impl.allocate(spv::OpIEqual, bool_type);
	compare_ref_zero_op->add_id(ref_composite_op->id);
	compare_ref_zero_op->add_id(zero_vector);
	impl.add(compare_ref_zero_op);

	auto *ref_src_diff_op = impl.allocate(spv::OpISub, uint32_vector_type);
	ref_src_diff_op->add_id(ref_composite_op->id);
	ref_src_diff_op->add_id(src_composite_op->id);
	impl.add(ref_src_diff_op);

	auto *abs_diff_op = impl.allocate(spv::OpExtInst, uint32_vector_type);
	abs_diff_op->add_id(impl.glsl_std450_ext);
	abs_diff_op->add_literal(GLSLstd450SAbs);
	abs_diff_op->add_id(ref_src_diff_op->id);
	impl.add(abs_diff_op);

	auto *masked_diff_op = impl.allocate(spv::OpSelect, uint32_vector_type);
	masked_diff_op->add_id(compare_ref_zero_op->id);
	masked_diff_op->add_id(zero_vector);
	masked_diff_op->add_id(abs_diff_op->id);
	impl.add(masked_diff_op);

	spv::Id sum_id = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *extract_op = impl.allocate(spv::OpCompositeExtract, uint32_scalar_type);
		extract_op->add_id(masked_diff_op->id);
		extract_op->add_literal(i);
		impl.add(extract_op);

		if (sum_id)
		{
			auto *add_op = impl.allocate(spv::OpIAdd, uint32_scalar_type);
			add_op->add_id(sum_id);
			add_op->add_id(extract_op->id);
			impl.add(add_op);

			sum_id = add_op->id;
		}
		else
			sum_id = extract_op->id;
	}

	/* DXIL docs say that the addition should saturate on overflow,
	 * but but drivers don't seem to do that. */
	auto *add_op = impl.allocate(spv::OpIAdd, instruction);
	add_op->add_id(impl.get_id_for_value(instruction->getOperand(3)));
	add_op->add_id(sum_id);
	impl.add(add_op);

	return true;
}